

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.cpp
# Opt level: O1

void simdjson::internal::dtoa_impl::grisu2_digit_gen
               (char *buffer,int *length,int *decimal_exponent,diyfp M_minus,diyfp w,diyfp M_plus)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  uint local_6c;
  
  bVar2 = -(char)M_plus.e;
  uVar9 = 1L << (bVar2 & 0x3f);
  uVar4 = M_plus.f >> (bVar2 & 0x3f);
  uVar3 = (uint)uVar4;
  if (uVar3 < 1000000000) {
    if (uVar3 < 100000000) {
      if (uVar3 < 10000000) {
        if (uVar3 < 1000000) {
          if (uVar3 < 100000) {
            if (uVar3 < 10000) {
              if (uVar3 < 1000) {
                if (uVar3 < 100) {
                  local_6c = (uint)(9 < uVar3) * 9 + 1;
                  iVar11 = (9 < uVar3) + 1;
                }
                else {
                  iVar11 = 3;
                  local_6c = 100;
                }
              }
              else {
                iVar11 = 4;
                local_6c = 1000;
              }
            }
            else {
              iVar11 = 5;
              local_6c = 10000;
            }
          }
          else {
            iVar11 = 6;
            local_6c = 100000;
          }
        }
        else {
          iVar11 = 7;
          local_6c = 1000000;
        }
      }
      else {
        iVar11 = 8;
        local_6c = 10000000;
      }
    }
    else {
      iVar11 = 9;
      local_6c = 100000000;
    }
  }
  else {
    iVar11 = 10;
    local_6c = 1000000000;
  }
  uVar6 = M_plus.f - M_minus.f;
  uVar13 = M_plus.f - w.f;
  uVar14 = uVar9 - 1 & M_plus.f;
  do {
    if (iVar11 < 1) {
      iVar11 = 0;
      do {
        uVar7 = uVar13;
        uVar5 = uVar6;
        uVar4 = uVar14 * 10;
        uVar14 = uVar4 & uVar9 - 1;
        iVar1 = *length;
        *length = iVar1 + 1;
        buffer[iVar1] = (char)(uVar4 >> (bVar2 & 0x3f)) + '0';
        uVar6 = uVar5 * 10;
        uVar13 = uVar7 * 10;
        iVar11 = iVar11 + -1;
      } while (uVar6 < uVar14);
      *decimal_exponent = *decimal_exponent + iVar11;
      if ((uVar14 < uVar13) && (uVar9 <= uVar6 - uVar14)) {
        iVar11 = *length;
        uVar4 = uVar7 * 10 - uVar14;
        uVar14 = uVar14 + uVar9;
        uVar6 = uVar5 * 10 - uVar14;
        do {
          if ((uVar13 <= uVar14) && (uVar4 <= uVar7 * -10 + uVar14)) {
            return;
          }
          buffer[(long)iVar11 + -1] = buffer[(long)iVar11 + -1] + -1;
          bVar15 = uVar9 <= uVar6;
          uVar6 = uVar6 - uVar9;
          if (uVar13 <= uVar14) {
            return;
          }
          uVar4 = uVar4 - uVar9;
          uVar14 = uVar14 + uVar9;
        } while (bVar15);
      }
      return;
    }
    uVar5 = uVar4 & 0xffffffff;
    uVar4 = uVar5 % (ulong)local_6c;
    iVar1 = *length;
    *length = iVar1 + 1;
    buffer[iVar1] = (char)(uVar5 / local_6c) + '0';
    iVar11 = iVar11 + -1;
    uVar5 = (uVar4 << (bVar2 & 0x3f)) + uVar14;
    if (uVar6 < uVar5) {
      local_6c = local_6c / 10;
    }
    else {
      *decimal_exponent = *decimal_exponent + iVar11;
      uVar7 = (ulong)local_6c << (bVar2 & 0x3f);
      if ((uVar5 < uVar13) && (uVar7 <= uVar6 - uVar5)) {
        iVar1 = *length;
        uVar8 = (M_plus.f - w.f) - uVar5;
        uVar10 = uVar5 + uVar7;
        uVar12 = (M_plus.f - M_minus.f) - uVar10;
        do {
          if ((uVar13 <= uVar10) && (uVar8 <= uVar10 + (w.f - M_plus.f))) break;
          buffer[(long)iVar1 + -1] = buffer[(long)iVar1 + -1] + -1;
          bVar15 = uVar7 <= uVar12;
          uVar12 = uVar12 - uVar7;
          if (uVar13 <= uVar10) break;
          uVar8 = uVar8 - uVar7;
          uVar10 = uVar10 + uVar7;
        } while (bVar15);
      }
    }
    if (uVar5 <= uVar6) {
      return;
    }
  } while( true );
}

Assistant:

inline void grisu2_digit_gen(char *buffer, int &length, int &decimal_exponent,
                             diyfp M_minus, diyfp w, diyfp M_plus) {
  static_assert(kAlpha >= -60, "internal error");
  static_assert(kGamma <= -32, "internal error");

  // Generates the digits (and the exponent) of a decimal floating-point
  // number V = buffer * 10^decimal_exponent in the range [M-, M+]. The diyfp's
  // w, M- and M+ share the same exponent e, which satisfies alpha <= e <=
  // gamma.
  //
  //               <--------------------------- delta ---->
  //                                  <---- dist --------->
  // --------------[------------------+-------------------]--------------
  //               M-                 w                   M+
  //
  // Grisu2 generates the digits of M+ from left to right and stops as soon as
  // V is in [M-,M+].

  std::uint64_t delta =
      diyfp::sub(M_plus, M_minus)
          .f; // (significand of (M+ - M-), implicit exponent is e)
  std::uint64_t dist =
      diyfp::sub(M_plus, w)
          .f; // (significand of (M+ - w ), implicit exponent is e)

  // Split M+ = f * 2^e into two parts p1 and p2 (note: e < 0):
  //
  //      M+ = f * 2^e
  //         = ((f div 2^-e) * 2^-e + (f mod 2^-e)) * 2^e
  //         = ((p1        ) * 2^-e + (p2        )) * 2^e
  //         = p1 + p2 * 2^e

  const diyfp one(std::uint64_t{1} << -M_plus.e, M_plus.e);

  auto p1 = static_cast<std::uint32_t>(
      M_plus.f >>
      -one.e); // p1 = f div 2^-e (Since -e >= 32, p1 fits into a 32-bit int.)
  std::uint64_t p2 = M_plus.f & (one.f - 1); // p2 = f mod 2^-e

  // 1)
  //
  // Generate the digits of the integral part p1 = d[n-1]...d[1]d[0]

  std::uint32_t pow10;
  const int k = find_largest_pow10(p1, pow10);

  //      10^(k-1) <= p1 < 10^k, pow10 = 10^(k-1)
  //
  //      p1 = (p1 div 10^(k-1)) * 10^(k-1) + (p1 mod 10^(k-1))
  //         = (d[k-1]         ) * 10^(k-1) + (p1 mod 10^(k-1))
  //
  //      M+ = p1                                             + p2 * 2^e
  //         = d[k-1] * 10^(k-1) + (p1 mod 10^(k-1))          + p2 * 2^e
  //         = d[k-1] * 10^(k-1) + ((p1 mod 10^(k-1)) * 2^-e + p2) * 2^e
  //         = d[k-1] * 10^(k-1) + (                         rest) * 2^e
  //
  // Now generate the digits d[n] of p1 from left to right (n = k-1,...,0)
  //
  //      p1 = d[k-1]...d[n] * 10^n + d[n-1]...d[0]
  //
  // but stop as soon as
  //
  //      rest * 2^e = (d[n-1]...d[0] * 2^-e + p2) * 2^e <= delta * 2^e

  int n = k;
  while (n > 0) {
    // Invariants:
    //      M+ = buffer * 10^n + (p1 + p2 * 2^e)    (buffer = 0 for n = k)
    //      pow10 = 10^(n-1) <= p1 < 10^n
    //
    const std::uint32_t d = p1 / pow10; // d = p1 div 10^(n-1)
    const std::uint32_t r = p1 % pow10; // r = p1 mod 10^(n-1)
    //
    //      M+ = buffer * 10^n + (d * 10^(n-1) + r) + p2 * 2^e
    //         = (buffer * 10 + d) * 10^(n-1) + (r + p2 * 2^e)
    //
    buffer[length++] = static_cast<char>('0' + d); // buffer := buffer * 10 + d
    //
    //      M+ = buffer * 10^(n-1) + (r + p2 * 2^e)
    //
    p1 = r;
    n--;
    //
    //      M+ = buffer * 10^n + (p1 + p2 * 2^e)
    //      pow10 = 10^n
    //

    // Now check if enough digits have been generated.
    // Compute
    //
    //      p1 + p2 * 2^e = (p1 * 2^-e + p2) * 2^e = rest * 2^e
    //
    // Note:
    // Since rest and delta share the same exponent e, it suffices to
    // compare the significands.
    const std::uint64_t rest = (std::uint64_t{p1} << -one.e) + p2;
    if (rest <= delta) {
      // V = buffer * 10^n, with M- <= V <= M+.

      decimal_exponent += n;

      // We may now just stop. But instead look if the buffer could be
      // decremented to bring V closer to w.
      //
      // pow10 = 10^n is now 1 ulp in the decimal representation V.
      // The rounding procedure works with diyfp's with an implicit
      // exponent of e.
      //
      //      10^n = (10^n * 2^-e) * 2^e = ulp * 2^e
      //
      const std::uint64_t ten_n = std::uint64_t{pow10} << -one.e;
      grisu2_round(buffer, length, dist, delta, rest, ten_n);

      return;
    }

    pow10 /= 10;
    //
    //      pow10 = 10^(n-1) <= p1 < 10^n
    // Invariants restored.
  }

  // 2)
  //
  // The digits of the integral part have been generated:
  //
  //      M+ = d[k-1]...d[1]d[0] + p2 * 2^e
  //         = buffer            + p2 * 2^e
  //
  // Now generate the digits of the fractional part p2 * 2^e.
  //
  // Note:
  // No decimal point is generated: the exponent is adjusted instead.
  //
  // p2 actually represents the fraction
  //
  //      p2 * 2^e
  //          = p2 / 2^-e
  //          = d[-1] / 10^1 + d[-2] / 10^2 + ...
  //
  // Now generate the digits d[-m] of p1 from left to right (m = 1,2,...)
  //
  //      p2 * 2^e = d[-1]d[-2]...d[-m] * 10^-m
  //                      + 10^-m * (d[-m-1] / 10^1 + d[-m-2] / 10^2 + ...)
  //
  // using
  //
  //      10^m * p2 = ((10^m * p2) div 2^-e) * 2^-e + ((10^m * p2) mod 2^-e)
  //                = (                   d) * 2^-e + (                   r)
  //
  // or
  //      10^m * p2 * 2^e = d + r * 2^e
  //
  // i.e.
  //
  //      M+ = buffer + p2 * 2^e
  //         = buffer + 10^-m * (d + r * 2^e)
  //         = (buffer * 10^m + d) * 10^-m + 10^-m * r * 2^e
  //
  // and stop as soon as 10^-m * r * 2^e <= delta * 2^e

  int m = 0;
  for (;;) {
    // Invariant:
    //      M+ = buffer * 10^-m + 10^-m * (d[-m-1] / 10 + d[-m-2] / 10^2 + ...)
    //      * 2^e
    //         = buffer * 10^-m + 10^-m * (p2                                 )
    //         * 2^e = buffer * 10^-m + 10^-m * (1/10 * (10 * p2) ) * 2^e =
    //         buffer * 10^-m + 10^-m * (1/10 * ((10*p2 div 2^-e) * 2^-e +
    //         (10*p2 mod 2^-e)) * 2^e
    //
    p2 *= 10;
    const std::uint64_t d = p2 >> -one.e;     // d = (10 * p2) div 2^-e
    const std::uint64_t r = p2 & (one.f - 1); // r = (10 * p2) mod 2^-e
    //
    //      M+ = buffer * 10^-m + 10^-m * (1/10 * (d * 2^-e + r) * 2^e
    //         = buffer * 10^-m + 10^-m * (1/10 * (d + r * 2^e))
    //         = (buffer * 10 + d) * 10^(-m-1) + 10^(-m-1) * r * 2^e
    //
    buffer[length++] = static_cast<char>('0' + d); // buffer := buffer * 10 + d
    //
    //      M+ = buffer * 10^(-m-1) + 10^(-m-1) * r * 2^e
    //
    p2 = r;
    m++;
    //
    //      M+ = buffer * 10^-m + 10^-m * p2 * 2^e
    // Invariant restored.

    // Check if enough digits have been generated.
    //
    //      10^-m * p2 * 2^e <= delta * 2^e
    //              p2 * 2^e <= 10^m * delta * 2^e
    //                    p2 <= 10^m * delta
    delta *= 10;
    dist *= 10;
    if (p2 <= delta) {
      break;
    }
  }

  // V = buffer * 10^-m, with M- <= V <= M+.

  decimal_exponent -= m;

  // 1 ulp in the decimal representation is now 10^-m.
  // Since delta and dist are now scaled by 10^m, we need to do the
  // same with ulp in order to keep the units in sync.
  //
  //      10^m * 10^-m = 1 = 2^-e * 2^e = ten_m * 2^e
  //
  const std::uint64_t ten_m = one.f;
  grisu2_round(buffer, length, dist, delta, p2, ten_m);

  // By construction this algorithm generates the shortest possible decimal
  // number (Loitsch, Theorem 6.2) which rounds back to w.
  // For an input number of precision p, at least
  //
  //      N = 1 + ceil(p * log_10(2))
  //
  // decimal digits are sufficient to identify all binary floating-point
  // numbers (Matula, "In-and-Out conversions").
  // This implies that the algorithm does not produce more than N decimal
  // digits.
  //
  //      N = 17 for p = 53 (IEEE double precision)
  //      N = 9  for p = 24 (IEEE single precision)
}